

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O2

void voc_iterate(voccxdef *ctx,objnum objn,_func_void_void_ptr_vocdef_ptr_vocwdef_ptr *fn,
                void *fnctx)

{
  uint uVar1;
  vocdef *pvVar2;
  vocdef *pvVar3;
  vocwdef *pvVar4;
  bool bVar5;
  int local_3c;
  
  pvVar2 = (vocdef *)ctx->voccxhsh;
  local_3c = 0x100;
  while (bVar5 = local_3c != 0, local_3c = local_3c + -1, pvVar3 = pvVar2, bVar5) {
    while (pvVar3 = pvVar3->vocnxt, pvVar3 != (vocdef *)0x0) {
      uVar1 = pvVar3->vocwlst;
      if (uVar1 != 0xffffffff) goto LAB_00134f63;
      pvVar4 = (vocwdef *)0x0;
      while (pvVar4 != (vocwdef *)0x0) {
        if ((objn == 0xffff) || (pvVar4->vocwobj == objn)) {
          (*fn)(fnctx,pvVar3,pvVar4);
        }
        uVar1 = pvVar4->vocwnxt;
        pvVar4 = (vocwdef *)0x0;
        if (uVar1 != 0xffffffff) {
LAB_00134f63:
          pvVar4 = (vocwdef *)
                   ((long)&ctx->voccxwp[(ulong)uVar1 / 2000]->vocwnxt + (ulong)(uVar1 % 2000 << 3));
        }
      }
    }
    pvVar2 = (vocdef *)&pvVar2->voclen;
  }
  return;
}

Assistant:

void voc_iterate(voccxdef *ctx, objnum objn,
                 void (*fn)(void *, vocdef *, vocwdef *), void *fnctx)
{
    int       i;
    vocdef   *v;
    vocdef  **vp;
    vocwdef  *vw;
    uint      idx;

    /* go through each hash value looking for matching words */
    for (i = VOCHASHSIZ, vp = ctx->voccxhsh ; i ; ++vp, --i)
    {
        /* go through all words in this hash chain */
        for (v = *vp ; v ; v = v->vocnxt)
        {
            /* go through each object relation for this word */
            for (idx = v->vocwlst, vw = vocwget(ctx, idx) ; vw ;
                 idx = vw->vocwnxt, vw = vocwget(ctx, idx))
            {
                /*
                 *   if this word is for this object, call the callback
                 */
                if (objn == MCMONINV || vw->vocwobj == objn)
                    (*fn)(fnctx, v, vw);
            }
        }
    }
}